

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  anon_union_8192_4_fbc60714_for_scratch *paVar1;
  byte bVar2;
  xml_encoding xVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  value_type puVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  anon_union_8192_4_fbc60714_for_scratch *paVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  value_type i;
  ushort uVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  
  if (size == 0) {
    return;
  }
  xVar3 = this->encoding;
  if (xVar3 == encoding_utf8) {
    UNRECOVERED_JUMPTABLE = this->writer->_vptr_xml_writer[2];
    (*UNRECOVERED_JUMPTABLE)(this->writer,data,size,UNRECOVERED_JUMPTABLE);
    return;
  }
  paVar1 = &this->scratch;
  if ((xVar3 & ~encoding_utf8) == encoding_utf16_le) {
    lVar11 = 0x800;
    do {
      bVar2 = (byte)*(uint *)data;
      if ((char)bVar2 < '\0') {
        uVar14 = (uint)bVar2;
        if (((size == 1) || ((uVar14 & 0xffffffe0) != 0xc0)) ||
           ((*(byte *)((long)data + 1) & 0xc0) != 0x80)) {
          if ((((size < 3) || ((uVar14 & 0xfffffff0) != 0xe0)) ||
              ((*(byte *)((long)data + 1) & 0xffc0) != 0x80)) ||
             ((*(byte *)((long)data + 2) & 0xc0) != 0x80)) {
            if (((size < 4) || ((uVar14 & 0xfffffff8) != 0xf0)) ||
               (((*(byte *)((long)data + 1) & 0xffffffc0) != 0x80 ||
                (((*(byte *)((long)data + 2) & 0xc0) != 0x80 ||
                 (bVar2 = *(byte *)((long)data + 3), (bVar2 & 0xc0) != 0x80)))))) {
              data = (char_t *)((long)data + 1);
              size = size - 1;
            }
            else {
              uVar16 = (uint)*(byte *)((long)data + 2) << 6;
              *(short *)(this->buffer + lVar11) =
                   (short)((uVar16 & 0xc00) + 0x3ff0000 +
                           ((*(byte *)((long)data + 1) & 0x3f) << 0xc | (uVar14 & 7) << 0x12) >> 10)
                   + -0x2800;
              *(ushort *)(this->buffer + lVar11 + 2) =
                   bVar2 & 0x3f | (ushort)uVar16 & 0x3ff | 0xdc00;
              lVar11 = lVar11 + 4;
              data = (char_t *)((long)data + 4);
              size = size - 4;
            }
          }
          else {
            *(ushort *)(this->buffer + lVar11) =
                 *(byte *)((long)data + 2) & 0x3f |
                 (*(byte *)((long)data + 1) & 0x3f) << 6 | (ushort)bVar2 << 0xc;
            lVar11 = lVar11 + 2;
            data = (char_t *)((long)data + 3);
            size = size - 3;
          }
        }
        else {
          *(ushort *)(this->buffer + lVar11) =
               *(byte *)((long)data + 1) & 0x3f | (ushort)((uVar14 & 0x1f) << 6);
          lVar11 = lVar11 + 2;
          data = (char_t *)((long)data + 2);
          size = size - 2;
        }
      }
      else {
        *(ushort *)(this->buffer + lVar11) = (ushort)bVar2;
        lVar11 = lVar11 + 2;
        data = (char_t *)((long)data + 1);
        size = size - 1;
        if ((3 < size) && (((ulong)data & 3) == 0)) {
          do {
            if ((*(uint *)data & 0x80808080) != 0) break;
            *(ushort *)(this->buffer + lVar11) = (ushort)(byte)*(uint *)data;
            *(ushort *)(this->buffer + lVar11 + 2) = (ushort)*(byte *)((long)data + 1);
            *(ushort *)(this->buffer + lVar11 + 4) = (ushort)*(byte *)((long)data + 2);
            *(ushort *)(this->buffer + lVar11 + 6) = (ushort)*(byte *)((long)data + 3);
            lVar11 = lVar11 + 8;
            data = (char_t *)((long)data + 4);
            size = size - 4;
          } while (3 < size);
        }
      }
    } while (size != 0);
    if (lVar11 != 0x800 && xVar3 != encoding_utf16_le) {
      auVar18 = vpbroadcastq_avx512f();
      auVar18 = vpsrlq_avx512f(auVar18,1);
      lVar10 = 0;
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar23 = vbroadcasti32x4_avx512f(_DAT_00181100);
      do {
        auVar24 = vpbroadcastq_avx512f();
        auVar25 = vporq_avx512f(auVar24,auVar19);
        auVar26 = vporq_avx512f(auVar24,auVar20);
        auVar27 = vporq_avx512f(auVar24,auVar21);
        auVar24 = vporq_avx512f(auVar24,auVar22);
        uVar4 = vpcmpuq_avx512f(auVar24,auVar18,2);
        uVar5 = vpcmpuq_avx512f(auVar27,auVar18,2);
        uVar6 = vpcmpuq_avx512f(auVar26,auVar18,2);
        uVar7 = vpcmpuq_avx512f(auVar25,auVar18,2);
        bVar2 = (byte)uVar7;
        uVar17 = CONCAT11(bVar2,(byte)uVar6);
        uVar14 = CONCAT22(uVar17,CONCAT11((byte)uVar5,(byte)uVar4));
        auVar24 = vmovdqu16_avx512bw(*(undefined1 (*) [64])((long)paVar1 + lVar10 * 2));
        auVar25._2_2_ = (ushort)((byte)(uVar14 >> 1) & 1) * auVar24._2_2_;
        auVar25._0_2_ = (ushort)((byte)uVar4 & 1) * auVar24._0_2_;
        auVar25._4_2_ = (ushort)((byte)(uVar14 >> 2) & 1) * auVar24._4_2_;
        auVar25._6_2_ = (ushort)((byte)(uVar14 >> 3) & 1) * auVar24._6_2_;
        auVar25._8_2_ = (ushort)((byte)(uVar14 >> 4) & 1) * auVar24._8_2_;
        auVar25._10_2_ = (ushort)((byte)(uVar14 >> 5) & 1) * auVar24._10_2_;
        auVar25._12_2_ = (ushort)((byte)(uVar14 >> 6) & 1) * auVar24._12_2_;
        auVar25._14_2_ = (ushort)((byte)(uVar14 >> 7) & 1) * auVar24._14_2_;
        auVar25._16_2_ = (ushort)((byte)uVar5 & 1) * auVar24._16_2_;
        auVar25._18_2_ = (ushort)((byte)(uVar14 >> 9) & 1) * auVar24._18_2_;
        auVar25._20_2_ = (ushort)((byte)(uVar14 >> 10) & 1) * auVar24._20_2_;
        auVar25._22_2_ = (ushort)((byte)(uVar14 >> 0xb) & 1) * auVar24._22_2_;
        auVar25._24_2_ = (ushort)((byte)(uVar14 >> 0xc) & 1) * auVar24._24_2_;
        auVar25._26_2_ = (ushort)((byte)(uVar14 >> 0xd) & 1) * auVar24._26_2_;
        auVar25._28_2_ = (ushort)((byte)(uVar14 >> 0xe) & 1) * auVar24._28_2_;
        auVar25._30_2_ = (ushort)((byte)(uVar14 >> 0xf) & 1) * auVar24._30_2_;
        auVar25._32_2_ = (ushort)((byte)uVar6 & 1) * auVar24._32_2_;
        auVar25._34_2_ = (ushort)((byte)(uVar17 >> 1) & 1) * auVar24._34_2_;
        auVar25._36_2_ = (ushort)((byte)(uVar17 >> 2) & 1) * auVar24._36_2_;
        auVar25._38_2_ = (ushort)((byte)(uVar17 >> 3) & 1) * auVar24._38_2_;
        auVar25._40_2_ = (ushort)((byte)(uVar17 >> 4) & 1) * auVar24._40_2_;
        auVar25._42_2_ = (ushort)((byte)(uVar17 >> 5) & 1) * auVar24._42_2_;
        auVar25._44_2_ = (ushort)((byte)(uVar17 >> 6) & 1) * auVar24._44_2_;
        auVar25._46_2_ = (ushort)((byte)(uVar17 >> 7) & 1) * auVar24._46_2_;
        auVar25._48_2_ = (ushort)(bVar2 & 1) * auVar24._48_2_;
        auVar25._50_2_ = (ushort)(bVar2 >> 1 & 1) * auVar24._50_2_;
        auVar25._52_2_ = (ushort)(bVar2 >> 2 & 1) * auVar24._52_2_;
        auVar25._54_2_ = (ushort)(bVar2 >> 3 & 1) * auVar24._54_2_;
        auVar25._56_2_ = (ushort)(bVar2 >> 4 & 1) * auVar24._56_2_;
        auVar25._58_2_ = (ushort)(bVar2 >> 5 & 1) * auVar24._58_2_;
        auVar25._60_2_ = (ushort)(bVar2 >> 6 & 1) * auVar24._60_2_;
        auVar25._62_2_ = (ushort)(bVar2 >> 7) * auVar24._62_2_;
        auVar24 = vpshufb_avx512bw(auVar25,auVar23);
        auVar24 = vmovdqu16_avx512bw(auVar24);
        *(undefined1 (*) [64])((long)paVar1 + lVar10 * 2) = auVar24;
        lVar10 = lVar10 + 0x20;
      } while ((lVar11 - 0x802U >> 1 & 0xffffffffffffffe0) + 0x20 != lVar10);
    }
    uVar12 = lVar11 - 0x800;
  }
  else if (xVar3 - encoding_utf32_le < 2) {
    puVar8 = utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_writer>
                       (data,size,paVar1);
    uVar12 = (long)puVar8 - (long)paVar1->data_u8;
    if (uVar12 != 0 && xVar3 != encoding_utf32_le) {
      auVar18 = vpbroadcastq_avx512f();
      auVar18 = vpsrlq_avx512f(auVar18,2);
      uVar9 = 0;
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar21 = vbroadcasti32x4_avx512f(_DAT_001810f0);
      do {
        auVar22 = vpbroadcastq_avx512f();
        auVar23 = vporq_avx512f(auVar22,auVar19);
        auVar22 = vporq_avx512f(auVar22,auVar20);
        uVar4 = vpcmpuq_avx512f(auVar22,auVar18,2);
        uVar5 = vpcmpuq_avx512f(auVar23,auVar18,2);
        bVar2 = (byte)uVar5;
        uVar17 = CONCAT11(bVar2,(byte)uVar4);
        auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)paVar1 + uVar9 * 4));
        auVar22._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar23._4_4_;
        auVar22._0_4_ = (uint)((byte)uVar4 & 1) * auVar23._0_4_;
        auVar22._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar23._8_4_;
        auVar22._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar23._12_4_;
        auVar22._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar23._16_4_;
        auVar22._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar23._20_4_;
        auVar22._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar23._24_4_;
        auVar22._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar23._28_4_;
        auVar22._32_4_ = (uint)(bVar2 & 1) * auVar23._32_4_;
        auVar22._36_4_ = (uint)(bVar2 >> 1 & 1) * auVar23._36_4_;
        auVar22._40_4_ = (uint)(bVar2 >> 2 & 1) * auVar23._40_4_;
        auVar22._44_4_ = (uint)(bVar2 >> 3 & 1) * auVar23._44_4_;
        auVar22._48_4_ = (uint)(bVar2 >> 4 & 1) * auVar23._48_4_;
        auVar22._52_4_ = (uint)(bVar2 >> 5 & 1) * auVar23._52_4_;
        auVar22._56_4_ = (uint)(bVar2 >> 6 & 1) * auVar23._56_4_;
        auVar22._60_4_ = (uint)(bVar2 >> 7) * auVar23._60_4_;
        auVar22 = vpshufb_avx512bw(auVar22,auVar21);
        auVar22 = vmovdqu32_avx512f(auVar22);
        *(undefined1 (*) [64])((long)paVar1 + uVar9 * 4) = auVar22;
        uVar9 = uVar9 + 0x10;
      } while ((((ulong)((long)puVar8 + (-0x804 - (long)this)) >> 2) + 0x10 & 0x7ffffffffffffff0) !=
               uVar9);
    }
  }
  else {
    paVar13 = paVar1;
    if (xVar3 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0xe67,
                    "size_t pugi::impl::(anonymous namespace)::convert_buffer_output(char_t *, uint8_t *, uint16_t *, uint32_t *, const char_t *, size_t, xml_encoding)"
                   );
    }
    do {
      bVar2 = (byte)*(uint *)data;
      if ((char)bVar2 < '\0') {
        if ((((size < 3) || ((bVar2 & 0xf0) != 0xe0)) ||
            ((*(byte *)((long)data + 1) & 0xc0) != 0x80)) ||
           ((*(byte *)((long)data + 2) & 0xc0) != 0x80)) {
          data = (char_t *)((long)data + 1);
          size = size - 1;
        }
        else {
          uVar14 = (uint)*(byte *)((long)data + 1) << 6;
          bVar15 = *(byte *)((long)data + 2) & 0x3f | (byte)uVar14;
          if ((uVar14 & 0xf00) != 0 || (bVar2 & 0xf) != 0) {
            bVar15 = 0x3f;
          }
          paVar13->data_u8[0] = bVar15;
          paVar13 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar13 + 1);
          data = (char_t *)((long)data + 3);
          size = size - 3;
        }
      }
      else {
        paVar13->data_u8[0] = bVar2;
        paVar13 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar13->data_u8 + 1);
        data = (char_t *)((long)data + 1);
        size = size - 1;
        if ((3 < size) && (((ulong)data & 3) == 0)) {
          do {
            if ((*(uint *)data & 0x80808080) != 0) break;
            paVar13->data_u8[0] = (byte)*(uint *)data;
            paVar13->data_u8[1] = *(byte *)((long)data + 1);
            paVar13->data_u8[2] = *(byte *)((long)data + 2);
            paVar13->data_u8[3] = *(byte *)((long)data + 3);
            paVar13 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar13->data_u8 + 4);
            data = (char_t *)((long)data + 4);
            size = size - 4;
          } while (3 < size);
        }
      }
    } while (size != 0);
    uVar12 = (long)paVar13 - (long)paVar1->data_u8;
  }
  if (uVar12 < 0x2001) {
    (*this->writer->_vptr_xml_writer[2])(this->writer,paVar1);
    return;
  }
  __assert_fail("result <= sizeof(scratch)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                ,0xe89,
                "void pugi::impl::(anonymous namespace)::xml_buffered_writer::flush(const char_t *, size_t)"
               );
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer_output(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}